

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O0

string * __thiscall KMeans::genKMeansFunction_abi_cxx11_(KMeans *this)

{
  bool bVar1;
  reference ppAVar2;
  Application *this_00;
  reference pvVar3;
  long in_RSI;
  string *in_RDI;
  string origView;
  size_t origViewID;
  size_t *origVar;
  string *attName;
  Attribute *att;
  size_t var;
  string categUpdates;
  string returnString;
  string numCategVar;
  View *gridView;
  string gridViewName;
  size_t *gridViewID;
  key_type *in_stack_ffffffffffffe748;
  QueryCompiler *in_stack_ffffffffffffe750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe758;
  undefined7 in_stack_ffffffffffffe760;
  byte in_stack_ffffffffffffe767;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  unsigned_long in_stack_ffffffffffffe788;
  string local_1848 [32];
  string local_1828 [32];
  string local_1808 [32];
  string local_17e8 [32];
  string local_17c8 [32];
  string local_17a8 [32];
  string local_1788 [32];
  string local_1768 [32];
  string local_1748 [32];
  string local_1728 [32];
  string local_1708 [32];
  string local_16e8 [32];
  string local_16c8 [32];
  string local_16a8 [32];
  string local_1688 [32];
  string local_1668 [32];
  string local_1648 [32];
  string local_1628 [32];
  string local_1608 [32];
  string local_15e8 [32];
  string local_15c8 [32];
  string local_15a8 [32];
  string local_1588 [32];
  string local_1568 [32];
  string local_1548 [32];
  string local_1528 [32];
  string local_1508 [32];
  string local_14e8 [32];
  string local_14c8 [32];
  string local_14a8 [32];
  string local_1488 [32];
  string local_1468 [32];
  string local_1448 [32];
  string local_1428 [32];
  string local_1408 [32];
  string local_13e8 [32];
  string local_13c8 [32];
  string local_13a8 [32];
  string local_1388 [32];
  string local_1368 [32];
  string local_1348 [32];
  string local_1328 [32];
  string local_1308 [32];
  string local_12e8 [32];
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [32];
  string local_1268 [32];
  string local_1248 [32];
  string local_1228 [32];
  string local_1208 [32];
  string local_11e8 [32];
  string local_11c8 [32];
  string local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  unsigned_long local_1148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1140;
  reference local_1138;
  string *local_1128;
  Attribute *local_1120;
  reference local_1118;
  ulong local_1108;
  allocator local_10f9;
  string local_10f8 [32];
  string local_10d8 [32];
  string local_10b8 [32];
  string local_1098 [32];
  string local_1078 [32];
  string local_1058 [32];
  string local_1038 [32];
  string local_1018 [32];
  string local_ff8 [32];
  string local_fd8 [32];
  string local_fb8 [32];
  string local_f98 [32];
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  string local_f18 [32];
  string local_ef8 [32];
  string local_ed8 [32];
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [32];
  string local_e58 [32];
  string local_e38 [32];
  string local_e18 [32];
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [32];
  string local_d98 [32];
  string local_d78 [32];
  string local_d58 [32];
  string local_d38 [32];
  string local_d18 [32];
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [32];
  string local_b18 [32];
  string local_af8 [32];
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [39];
  undefined1 local_b1 [33];
  string local_90 [32];
  Application *local_70;
  string local_58 [32];
  string local_38 [8];
  string *in_stack_ffffffffffffffd0;
  KMeans *in_stack_ffffffffffffffd8;
  
  ppAVar2 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                      (&countQuery->_aggregates,0);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator[](&(*ppAVar2)->_incoming,0);
  std::__cxx11::to_string(in_stack_ffffffffffffe788);
  std::operator+((char *)in_stack_ffffffffffffe758,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe750);
  std::__cxx11::string::~string(local_58);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x26a216);
  this_00 = (Application *)
            QueryCompiler::getView(in_stack_ffffffffffffe750,(size_t)in_stack_ffffffffffffe748);
  local_70 = this_00;
  std::bitset<100UL>::count((bitset<100UL> *)0x26a24b);
  std::__cxx11::to_string((unsigned_long)this_00);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b1 + 1),"\n",(allocator *)__rhs);
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::__cxx11::string::operator+=((string *)(local_b1 + 1),local_d8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_478);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_458);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_3f8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_398);
  genClusterInitialization(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::operator+=((string *)(local_b1 + 1),local_4b8);
  std::__cxx11::string::~string(local_4b8);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::__cxx11::string::operator+=((string *)(local_b1 + 1),local_4d8);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_4f8);
  std::__cxx11::string::~string(local_f18);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string(local_ef8);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_ed8);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_eb8);
  std::__cxx11::string::~string(local_638);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_e98);
  std::__cxx11::string::~string(local_678);
  std::__cxx11::string::~string(local_698);
  std::__cxx11::string::~string(local_e78);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_6d8);
  std::__cxx11::string::~string(local_e58);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_718);
  std::__cxx11::string::~string(local_e38);
  std::__cxx11::string::~string(local_738);
  std::__cxx11::string::~string(local_758);
  std::__cxx11::string::~string(local_e18);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string(local_df8);
  std::__cxx11::string::~string(local_7b8);
  std::__cxx11::string::~string(local_7d8);
  std::__cxx11::string::~string(local_7f8);
  std::__cxx11::string::~string(local_818);
  std::__cxx11::string::~string(local_838);
  std::__cxx11::string::~string(local_dd8);
  std::__cxx11::string::~string(local_858);
  std::__cxx11::string::~string(local_878);
  std::__cxx11::string::~string(local_db8);
  std::__cxx11::string::~string(local_898);
  std::__cxx11::string::~string(local_8b8);
  std::__cxx11::string::~string(local_d98);
  std::__cxx11::string::~string(local_8d8);
  std::__cxx11::string::~string(local_8f8);
  std::__cxx11::string::~string(local_d78);
  std::__cxx11::string::~string(local_918);
  std::__cxx11::string::~string(local_938);
  std::__cxx11::string::~string(local_d58);
  std::__cxx11::string::~string(local_958);
  std::__cxx11::string::~string(local_978);
  std::__cxx11::string::~string(local_d38);
  std::__cxx11::string::~string(local_998);
  std::__cxx11::string::~string(local_9b8);
  std::__cxx11::string::~string(local_d18);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_9f8);
  std::__cxx11::string::~string(local_cf8);
  std::__cxx11::string::~string(local_a18);
  std::__cxx11::string::~string(local_a38);
  std::__cxx11::string::~string(local_cd8);
  std::__cxx11::string::~string(local_a58);
  std::__cxx11::string::~string(local_a78);
  std::__cxx11::string::~string(local_cb8);
  std::__cxx11::string::~string(local_a98);
  std::__cxx11::string::~string(local_ab8);
  std::__cxx11::string::~string(local_c98);
  std::__cxx11::string::~string(local_ad8);
  std::__cxx11::string::~string(local_af8);
  std::__cxx11::string::~string(local_c78);
  std::__cxx11::string::~string(local_b18);
  std::__cxx11::string::~string(local_b38);
  std::__cxx11::string::~string(local_c58);
  std::__cxx11::string::~string(local_b58);
  std::__cxx11::string::~string(local_b78);
  std::__cxx11::string::~string(local_c38);
  std::__cxx11::string::~string(local_b98);
  std::__cxx11::string::~string(local_bb8);
  std::__cxx11::string::~string(local_c18);
  std::__cxx11::string::~string(local_bd8);
  std::__cxx11::string::~string(local_bf8);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::__cxx11::string::operator+=((string *)(local_b1 + 1),local_f38);
  std::__cxx11::string::~string(local_f38);
  std::__cxx11::string::~string(local_f58);
  std::__cxx11::string::~string(local_10d8);
  std::__cxx11::string::~string(local_f78);
  std::__cxx11::string::~string(local_f98);
  std::__cxx11::string::~string(local_10b8);
  std::__cxx11::string::~string(local_fb8);
  std::__cxx11::string::~string(local_fd8);
  std::__cxx11::string::~string(local_1098);
  std::__cxx11::string::~string(local_ff8);
  std::__cxx11::string::~string(local_1018);
  std::__cxx11::string::~string(local_1078);
  std::__cxx11::string::~string(local_1038);
  std::__cxx11::string::~string(local_1058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10f8,"",&local_10f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f9);
  for (local_1108 = 0; local_1108 < 100; local_1108 = local_1108 + 1) {
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)in_stack_ffffffffffffe758,(size_t)in_stack_ffffffffffffe750);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffe750);
    std::bitset<100UL>::reference::~reference(&local_1118);
    if (bVar1) {
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x26b8b4);
      local_1120 = TreeDecomposition::getAttribute
                             ((TreeDecomposition *)
                              CONCAT17(in_stack_ffffffffffffe767,in_stack_ffffffffffffe760),
                              (size_t)in_stack_ffffffffffffe758);
      local_1128 = &local_1120->_name;
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_ffffffffffffe758,(size_t)in_stack_ffffffffffffe750);
      in_stack_ffffffffffffe767 =
           std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffe750);
      std::bitset<100UL>::reference::~reference(&local_1138);
      if ((in_stack_ffffffffffffe767 & 1) == 0) {
        Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        std::__cxx11::string::operator+=((string *)(local_b1 + 1),local_1348);
        std::__cxx11::string::~string(local_1348);
        std::__cxx11::string::~string(local_1368);
        std::__cxx11::string::~string(local_1388);
        std::__cxx11::string::~string(local_13a8);
        std::__cxx11::string::~string(local_13c8);
        std::__cxx11::string::~string(local_13e8);
        std::__cxx11::string::~string(local_1408);
      }
      else {
        in_stack_ffffffffffffe758 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
        in_stack_ffffffffffffe750 = (QueryCompiler *)0x0;
        local_1140 = in_stack_ffffffffffffe758;
        ppAVar2 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                            ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                             (*(long *)(in_RSI + 0x100 +
                                       *(mapped_type *)in_stack_ffffffffffffe758 * 8) + 0x18),0);
        pvVar3 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](&(*ppAVar2)->_incoming,(size_type)in_stack_ffffffffffffe750);
        local_1148 = pvVar3->first;
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((char *)in_stack_ffffffffffffe758,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe750);
        std::__cxx11::string::~string(local_1188);
        Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
        std::__cxx11::string::operator+=(local_10f8,local_11a8);
        std::__cxx11::string::~string(local_11a8);
        std::__cxx11::string::~string(local_11c8);
        std::__cxx11::string::~string(local_11e8);
        std::__cxx11::string::~string(local_1208);
        std::__cxx11::string::~string(local_1228);
        std::__cxx11::string::~string(local_1248);
        std::__cxx11::string::~string(local_1268);
        std::__cxx11::string::~string(local_1288);
        std::__cxx11::string::~string(local_1328);
        std::__cxx11::string::~string(local_12a8);
        std::__cxx11::string::~string(local_12c8);
        std::__cxx11::string::~string(local_12e8);
        std::__cxx11::string::~string(local_1308);
        std::__cxx11::string::~string(local_1168);
      }
    }
  }
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+(in_stack_ffffffffffffe758,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::__cxx11::string::operator+=((string *)(local_b1 + 1),local_1428);
  std::__cxx11::string::~string(local_1428);
  std::__cxx11::string::~string(local_1448);
  std::__cxx11::string::~string(local_1468);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::__cxx11::string::operator+=((string *)(local_b1 + 1),local_1488);
  std::__cxx11::string::~string(local_1488);
  std::__cxx11::string::~string(local_14a8);
  std::__cxx11::string::~string(local_14c8);
  std::__cxx11::string::~string(local_17c8);
  std::__cxx11::string::~string(local_14e8);
  std::__cxx11::string::~string(local_1508);
  std::__cxx11::string::~string(local_1528);
  std::__cxx11::string::~string(local_17a8);
  std::__cxx11::string::~string(local_1548);
  std::__cxx11::string::~string(local_1568);
  std::__cxx11::string::~string(local_1788);
  std::__cxx11::string::~string(local_1588);
  std::__cxx11::string::~string(local_15a8);
  std::__cxx11::string::~string(local_1768);
  std::__cxx11::string::~string(local_15c8);
  std::__cxx11::string::~string(local_15e8);
  std::__cxx11::string::~string(local_1608);
  std::__cxx11::string::~string(local_1748);
  std::__cxx11::string::~string(local_1628);
  std::__cxx11::string::~string(local_1648);
  std::__cxx11::string::~string(local_1668);
  std::__cxx11::string::~string(local_1728);
  std::__cxx11::string::~string(local_1688);
  std::__cxx11::string::~string(local_16a8);
  std::__cxx11::string::~string(local_1708);
  std::__cxx11::string::~string(local_16c8);
  std::__cxx11::string::~string(local_16e8);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::__cxx11::string::operator+=((string *)(local_b1 + 1),local_17e8);
  std::__cxx11::string::~string(local_17e8);
  std::__cxx11::string::~string(local_1808);
  Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+(in_stack_ffffffffffffe758,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe750);
  std::operator+(in_stack_ffffffffffffe758,(char *)in_stack_ffffffffffffe750);
  std::__cxx11::string::~string(local_1828);
  std::__cxx11::string::~string(local_1848);
  std::__cxx11::string::~string(local_10f8);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string KMeans::genKMeansFunction()
{
    // Get view for grid query -- equivalent to count query
    const size_t& gridViewID = countQuery->_aggregates[0]->_incoming[0].first;
    std::string gridViewName = "V"+std::to_string(gridViewID);
    View* gridView = _compiler->getView(gridViewID);

    const std::string numCategVar = std::to_string(_isCategoricalFeature.count()/2); 

    std::string returnString = "\n";

    // KMeans Function
    returnString += offset(1)+"void kMeans()\n"+offset(1)+"{\n"+
        offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n"+
        offset(2)+"const size_t grid_size = "+gridViewName+".size();\n"+
        offset(2)+"size_t best_cluster, iteration = 0;\n\n"+
        offset(2)+"double dist, min_dist, distance_to_mean["+numCategVar+" * k * k];\n"+
        offset(2)+"std::vector<size_t> assignments(grid_size,0);\n"+
        offset(2)+"bool clustersChanged = true;\n\n"+
        offset(2)+"Cluster_mean means[k] = {}, cluster_sums[k] = {};\n\n";

    // if (_isCategoricalFeature.any())
    //     returnString += offset(2)+"onehotEncodeCategVars();\n\n";
    // returnString += offset(2)+"// Initialize the means\n"+
    //     offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
    //     offset(3)+"means[cluster] = "+gridViewName+"[rand() % "+
    //     gridViewName+".size()];\n\n";

    // Code that initializes the clusters
    returnString += genClusterInitialization(gridViewName);

    // If we are gcc, we can use openmp to paralellize the computation do loop
    // for KMeans
#if USE_OMP 

    size_t nthreads = std::thread::hardware_concurrency();
    std::string nthreadString = std::to_string(nthreads);
    
    // Open do loop
    returnString += offset(2)+"Cluster_mean localClusterSums[k*"+
        nthreadString+"] = {};\n"+
        offset(2)+"bool localClustersChanged["+nthreadString+"];\n\n"+
        offset(2)+"do\n"+offset(2)+"{\n"+
        offset(3)+"clustersChanged = false;\n"+
        offset(3)+"// Reset the cluster sums to default values \n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(4)+"cluster_sums[cluster].reset();\n\n"+
        offset(3)+"computeMeanDistance(&distance_to_mean[0], &means[0]);\n\n"+
        offset(3)+"#pragma omp parallel num_threads("+nthreadString+") "+
        "private(min_dist,dist,best_cluster)\n"+
        offset(3)+"{\n"+
        offset(4)+"size_t thread_num = omp_get_thread_num();\n"+
        offset(4)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(4)+"localClusterSums[k*thread_num+cluster].reset();\n"+
        offset(4)+"localClustersChanged[thread_num] = false;\n\n"+
        offset(4)+"// iterate over grid points and find best cluster for each tuple\n"+
        offset(4)+"#pragma omp for\n"+
        offset(4)+"for (size_t tup = 0; tup < grid_size; ++tup)\n"+offset(4)+"{\n"+
        offset(5)+"min_dist = std::numeric_limits<double>::max();\n"+
        offset(5)+"best_cluster = k;\n\n"+
        offset(5)+"// Find clostest cluster to this grid point\n"+
        offset(5)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(5)+"{\n"+
        offset(6)+"distance(dist, "+gridViewName+"[tup], means[cluster],"+
        " cluster, &distance_to_mean[0]);\n"+
        offset(6)+"if (dist < min_dist)\n"+offset(6)+"{\n"+
        offset(7)+"min_dist = dist;\n"+offset(7)+"best_cluster = cluster;\n"+
        offset(6)+"}\n"+offset(5)+"}\n"+
        offset(5)+"localClustersChanged[thread_num] = "+
        "localClustersChanged[thread_num] || (assignments[tup] != best_cluster);\n"+
        offset(5)+"assignments[tup] = best_cluster;\n"+
        offset(5)+"localClusterSums[k*thread_num+best_cluster] += "+
        gridViewName+"[tup];\n"+offset(4)+"}\n"+offset(3)+"}\n\n";

    std::string clusterCount = "size_t cluster_count = ",
        clusterChange = "clustersChanged =";
    for (size_t thread = 0; thread < nthreads; ++thread)
    {
        clusterCount += "localClusterSums["+std::to_string(thread)+"*k+cluster].count+";
        clusterChange += " localClustersChanged["+std::to_string(thread)+"] ||";
    }
    clusterCount.pop_back();
    clusterChange.pop_back();
    clusterChange.pop_back();

    clusterCount += ";\n";
    clusterChange += ";\n";
    
    std::string contLocalUpdates = "", categLocalUpdates = "";

    // Compute the one-hot encoding for each categorical variable 
    for (size_t var=0; var < NUM_OF_VARIABLES; ++var)
    {
        if (gridView->_fVars[var])
        {
            Attribute* att = _td->getAttribute(var);
            const std::string& attName = att->_name;

            if (_isCategoricalFeature[var])
            {
                const size_t& origVar = clusterToVariableMap[var];                
                const size_t origViewID =
                    varToQuery[origVar]->_aggregates[0]->_incoming[0].first;
                const std::string origView = "V"+std::to_string(origViewID);
                
                categLocalUpdates +=
                    offset(4)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
                    offset(6)+"means[cluster]."+attName+"[i] = (";

                  for (size_t thread = 0; thread < nthreads; ++thread)
                {
                    categLocalUpdates += "localClusterSums["+std::to_string(thread)+
                        "*k+cluster]."+attName+"[i]+";
                }
                categLocalUpdates.pop_back();
                categLocalUpdates += ") / cluster_count;\n";
            }
            else
            {
                contLocalUpdates += offset(4)+"means[cluster]."+attName+" = (";
                for (size_t thread = 0; thread < nthreads; ++thread)
                {
                    contLocalUpdates += "localClusterSums["+std::to_string(thread)+
                        "*k+cluster]."+attName+"+";
                }
                contLocalUpdates.pop_back();
                contLocalUpdates += ") / cluster_count;\n";
            }
        }
    }
        
    returnString += offset(3)+"// Combine the clusters and update mean\n"+
        offset(3)+clusterChange+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(3)+"{\n"+
        offset(4)+clusterCount+contLocalUpdates+categLocalUpdates+offset(3)+"}\n";
    
#else // If we are on clang and cannot use openmp

    // Open do loop
    returnString +=
        offset(2)+"do\n"+offset(2)+"{\n"+
        offset(3)+"clustersChanged = false;\n"+
        offset(3)+"// Reset the cluster sums to default values \n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(4)+"cluster_sums[cluster].reset();\n\n"+
        offset(3)+"computeMeanDistance(&distance_to_mean[0], &means[0]);\n\n"+
        offset(3)+"// iterate over grid points and find best cluster for each tuple\n"+
        offset(3)+"for (size_t tup = 0; tup < grid_size; ++tup)\n"+offset(3)+"{\n"+
        offset(4)+"min_dist = std::numeric_limits<double>::max();\n"+
        offset(4)+"best_cluster = k;\n\n"+
        offset(4)+"// Find clostest cluster to this grid point\n"+
        offset(4)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(4)+"{\n"+
        offset(5)+"distance(dist, "+gridViewName+"[tup], means[cluster],"+
        " cluster, &distance_to_mean[0]);\n"+
        offset(5)+"if (dist < min_dist)\n"+offset(5)+"{\n"+
        offset(6)+"min_dist = dist;\n"+offset(6)+"best_cluster = cluster;\n"+
        offset(5)+"}\n"+offset(4)+"}\n"+
        offset(4)+"clustersChanged = clustersChanged || "+
        "(assignments[tup] != best_cluster);\n"+
        offset(4)+"assignments[tup] = best_cluster;\n"+
        offset(4)+"cluster_sums[best_cluster] += "+gridViewName+"[tup];\n"+
        offset(3)+"}\n\n";

    returnString += offset(3)+"// Update the means\n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(3)+"{\n"+
        offset(4)+"if (cluster_sums[cluster].count == 0)\n"+
        offset(5)+"continue;\n";

    std::string categUpdates = "";
    // Compute the one-hot encoding for each categorical variable 
    for (size_t var=0; var < NUM_OF_VARIABLES; ++var)
    {
        if (gridView->_fVars[var])
        {
            Attribute* att = _td->getAttribute(var);
            const std::string& attName = att->_name;

            if (_isCategoricalFeature[var])
            {
                const size_t& origVar = clusterToVariableMap[var];                
                const size_t origViewID =
                    varToQuery[origVar]->_aggregates[0]->_incoming[0].first;
                const std::string origView = "V"+std::to_string(origViewID);
                
                categUpdates +=
                    offset(4)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
                    offset(6)+"means[cluster]."+attName+"[i] = "+
                    "cluster_sums[cluster]."+attName+"[i] / "+
                    "cluster_sums[cluster].count;\n";
            }
            else
            {
                returnString += offset(4)+"means[cluster]."+attName+" = "+
                    "cluster_sums[cluster]."+attName+" / cluster_sums[cluster].count;\n";
            }
        }
    }

    returnString += categUpdates+offset(3)+"}\n";
#endif

    // returnString += 
    // "//TODO:TODO:check dispersion of the clusters and if clusters have converged\n";

    returnString += offset(3)+"++iteration;\n"+
      offset(2)+"} while(clustersChanged && iteration < 1000);\n\n"+
      offset(2)+"int64_t endProcess = duration_cast<milliseconds>("+
      "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
      offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
      "std::ofstream::app);\n"+
      offset(2)+"ofs << \"\\t\" << endInit << \"\\t\" << endProcess << \"\\t\" << iteration;\n"+
      offset(2)+"ofs.close();\n\n"+
      offset(2)+"std::cout << \"Kmeans Init: \"+"+
      "std::to_string(endInit)+\"ms.\\n\";\n"+
      offset(2)+"std::cout << \"Run kMeans: \"+"+
      "std::to_string(endProcess)+\"ms.\\n\";\n\n";// +
        // offset(2)+"std::cout << \"Number of Iterations: \"+"+
        // "std::to_string(iteration)+\"\\n\";\n\n";
    
    if (INCLUDE_EVALUATION)
        returnString += offset(2)+"evaluateModel(means);\n";
    return returnString+offset(1)+"}\n\n";
}